

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableGcCompactTransientBuffers(ImGuiTable *table)

{
  int iVar1;
  ImGuiContext *pIVar2;
  long lVar3;
  int n;
  long lVar4;
  
  pIVar2 = GImGui;
  ImDrawListSplitter::ClearFreeMemory(&table->DrawSplitter);
  ImVector<ImGuiTableColumnSortSpecs>::clear(&table->SortSpecsMulti);
  (table->SortSpecs).Specs = (ImGuiTableColumnSortSpecs *)0x0;
  table->IsSortSpecsDirty = true;
  ImVector<char>::clear(&(table->ColumnsNames).Buf);
  table->MemoryCompacted = true;
  iVar1 = table->ColumnsCount;
  lVar3 = 0x50;
  for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    *(undefined2 *)((long)&((table->Columns).Data)->Flags + lVar3) = 0xffff;
    lVar3 = lVar3 + 0x68;
  }
  (pIVar2->TablesLastTimeActive).Data[(int)(((long)table - (long)(pIVar2->Tables).Buf.Data) / 600)]
       = -1.0;
  return;
}

Assistant:

void ImGui::TableGcCompactTransientBuffers(ImGuiTable* table)
{
    //IMGUI_DEBUG_LOG("TableGcCompactTransientBuffers() id=0x%08X\n", table->ID);
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->MemoryCompacted == false);
    table->DrawSplitter.ClearFreeMemory();
    table->SortSpecsMulti.clear();
    table->SortSpecs.Specs = NULL;
    table->IsSortSpecsDirty = true;
    table->ColumnsNames.clear();
    table->MemoryCompacted = true;
    for (int n = 0; n < table->ColumnsCount; n++)
        table->Columns[n].NameOffset = -1;
    g.TablesLastTimeActive[g.Tables.GetIndex(table)] = -1.0f;
}